

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

Vec_Int_t * Gia_ManFirstFanouts(Gia_Man_t *p)

{
  uint uVar1;
  uint *puVar2;
  Vec_Int_t *pVVar3;
  int *__s;
  Gia_Obj_t *pGVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  
  uVar1 = p->nObjs;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  uVar8 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar8 = uVar1;
  }
  pVVar3->nCap = uVar8;
  if (uVar8 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)(int)uVar8 << 2);
  }
  pVVar3->pArray = __s;
  pVVar3->nSize = uVar1;
  memset(__s,0,(long)(int)uVar1 << 2);
  if ((0 < (int)uVar1) && (pGVar4 = p->pObjs, pGVar4 != (Gia_Obj_t *)0x0)) {
    uVar6 = 0;
    do {
      uVar7 = *(ulong *)pGVar4;
      uVar8 = (uint)uVar7;
      iVar5 = (int)uVar6;
      if ((uVar7 & 0x1fffffff) == 0x1fffffff || (int)uVar8 < 0) {
        if ((int)uVar8 < 0 && (int)(uVar7 & 0x1fffffff) != 0x1fffffff) {
          uVar8 = iVar5 - (uVar8 & 0x1fffffff);
joined_r0x00792f89:
          if (uVar1 <= uVar8) {
LAB_00792fb5:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if (__s[uVar8] == 0) {
            __s[uVar8] = iVar5;
          }
        }
      }
      else {
        uVar8 = iVar5 - (uVar8 & 0x1fffffff);
        if (uVar1 <= uVar8) goto LAB_00792fb5;
        if (__s[uVar8] == 0) {
          __s[uVar8] = iVar5;
          uVar7 = *(ulong *)pGVar4;
        }
        uVar8 = iVar5 - ((uint)(uVar7 >> 0x20) & 0x1fffffff);
        if (uVar1 <= uVar8) goto LAB_00792fb5;
        if (__s[uVar8] == 0) {
          __s[uVar8] = iVar5;
        }
        puVar2 = p->pMuxes;
        if ((puVar2 != (uint *)0x0) && (puVar2[uVar6] != 0)) {
          uVar8 = puVar2[uVar6];
          if (uVar8 == 0) goto LAB_00792fb5;
          if ((int)uVar8 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf2,"int Abc_Lit2Var(int)");
          }
          uVar8 = uVar8 >> 1;
          goto joined_r0x00792f89;
        }
      }
      uVar6 = uVar6 + 1;
      pGVar4 = pGVar4 + 1;
    } while (uVar1 != uVar6);
  }
  return pVVar3;
}

Assistant:

Vec_Int_t * Gia_ManFirstFanouts( Gia_Man_t * p )
{
    Vec_Int_t * vFans = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
        {
            if ( Vec_IntEntry(vFans, Gia_ObjFaninId0p(p, pObj)) == 0 )
                Vec_IntWriteEntry(vFans, Gia_ObjFaninId0p(p, pObj), i);
            if ( Vec_IntEntry(vFans, Gia_ObjFaninId1p(p, pObj)) == 0 )
                Vec_IntWriteEntry(vFans, Gia_ObjFaninId1p(p, pObj), i);
            if ( Gia_ObjIsMuxId(p, i) && Vec_IntEntry(vFans, Gia_ObjFaninId2p(p, pObj)) == 0 )
                Vec_IntWriteEntry(vFans, Gia_ObjFaninId2p(p, pObj), i);
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            if ( Vec_IntEntry(vFans, Gia_ObjFaninId0p(p, pObj)) == 0 )
                Vec_IntWriteEntry(vFans, Gia_ObjFaninId0p(p, pObj), i);
        }
    }
    return vFans;
}